

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O1

Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *
gimage::medianDownscaleImage<unsigned_short>
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *__return_storage_ptr__,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,int factor)

{
  int iVar1;
  long lVar2;
  unsigned_short ***pppuVar3;
  pointer __first;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  __last;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  vector<unsigned_short,_std::allocator<unsigned_short>_> v;
  value_type_conflict3 local_74;
  allocator_type local_71;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_70;
  ulong local_68;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_60;
  ulong local_58;
  ulong local_50;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  uVar13 = 1;
  if (1 < factor) {
    uVar13 = (ulong)(uint)factor;
  }
  lVar12 = image->width;
  lVar4 = image->height;
  iVar1 = image->depth;
  __return_storage_ptr__->depth = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->pixel = (unsigned_short *)0x0;
  __return_storage_ptr__->row = (unsigned_short **)0x0;
  __return_storage_ptr__->img = (unsigned_short ***)0x0;
  local_70 = __return_storage_ptr__;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
            (__return_storage_ptr__,(long)(lVar12 + (uVar13 - 1)) / (long)uVar13,
             (long)((uVar13 - 1) + lVar4) / (long)uVar13,(long)iVar1);
  local_74 = 0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_48,(ulong)(uint)((int)uVar13 * (int)uVar13),&local_74,&local_71);
  if (0 < image->depth) {
    lVar12 = 0;
    local_60 = image;
    do {
      if (0 < image->height) {
        uVar9 = 0;
        do {
          lVar4 = image->width;
          if (0 < lVar4) {
            local_68 = uVar9 / uVar13;
            uVar6 = 0;
            local_58 = uVar9;
            do {
              __first = local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar2 = image->height;
              uVar5 = 0;
              uVar11 = 0;
              do {
                if (lVar2 <= (long)(uVar9 + uVar5)) break;
                pppuVar3 = image->img;
                uVar11 = (ulong)(int)uVar11;
                uVar7 = uVar13;
                uVar8 = uVar6;
                do {
                  if (lVar4 <= (long)uVar8) break;
                  local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar11] =
                       pppuVar3[lVar12][uVar9 + uVar5][uVar8];
                  uVar11 = uVar11 + 1;
                  uVar8 = uVar8 + 1;
                  uVar7 = uVar7 - 1;
                } while (uVar7 != 0);
                uVar5 = uVar5 + 1;
              } while (uVar5 != uVar13);
              local_70->img[lVar12][local_68][uVar6 / uVar13] = 0;
              uVar10 = (uint)uVar11;
              if (0 < (int)uVar10) {
                __last._M_current =
                     (unsigned_short *)
                     ((ulong)(uVar10 & 0xfffffffe) +
                     (long)local_48.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start);
                local_50 = uVar6 / uVar13;
                std::
                __heap_select<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (local_48.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start,__last._M_current,
                           local_48.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start + (uVar11 & 0xffffffff));
                std::
                __sort_heap<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          ((__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                            )__first,__last,(_Iter_less_iter *)&local_74);
                local_70->img[lVar12][local_68][local_50] =
                     local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar10 >> 1];
                image = local_60;
                uVar9 = local_58;
              }
              uVar6 = uVar6 + uVar13;
              lVar4 = image->width;
            } while ((long)uVar6 < lVar4);
          }
          uVar9 = uVar9 + uVar13;
        } while ((long)uVar9 < image->height);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < image->depth);
  }
  if (local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_short *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return local_70;
}

Assistant:

Image<T> medianDownscaleImage(const Image<T> &image, int factor)
{
  factor=std::max(1, factor);

  Image<T> ret((image.getWidth()+factor-1)/factor,
               (image.getHeight()+factor-1)/factor, image.getDepth());

  std::vector<T> v(factor*factor, 0);

  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k+=factor)
    {
      for (long i=0; i<image.getWidth(); i+=factor)
      {
        int n=0;

        for (int kk=0; kk<factor && k+kk<image.getHeight(); kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            if (image.isValid(i+ii, k+kk))
            {
              v[n]=image.get(i+ii, k+kk, d);
              n++;
            }
          }
        }

        ret.setInvalid(i/factor, k/factor, d);

        if (n > 0)
        {
          partial_sort(v.begin(), v.begin()+(n>>1), v.begin()+n);
          ret.set(i/factor, k/factor, d, v[n>>1]);
        }
      }
    }
  }

  return ret;
}